

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Runner::runCurrentTest(Runner *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  uint uVar2;
  IReporter *pIVar3;
  TestCaseInfo *pTVar4;
  size_t sVar5;
  ConfigData *pCVar6;
  string *psVar7;
  Counts CVar8;
  TestFailureException *anon_var_0;
  undefined1 local_378 [8];
  Counts assertions;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Counts prevAssertions;
  string *redirectedCerr_local;
  string *redirectedCout_local;
  Runner *this_local;
  
  RunningTest::reset(this->m_runningTest);
  coutRedir.m_targetString = (string *)(this->m_totals).assertions.passed;
  pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar2 & 1) == 0) {
    pTVar4 = RunningTest::getTestCaseInfo(this->m_runningTest);
    TestCaseInfo::invoke(pTVar4);
  }
  else {
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&cerrRedir.m_targetString,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&assertions.failed,(ostream *)&std::cerr,redirectedCerr);
    pTVar4 = RunningTest::getTestCaseInfo(this->m_runningTest);
    TestCaseInfo::invoke(pTVar4);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&assertions.failed);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&cerrRedir.m_targetString);
  }
  CVar8 = Counts::operator-(&(this->m_totals).assertions,(Counts *)&coutRedir.m_targetString);
  assertions.passed = CVar8.failed;
  local_378 = (undefined1  [8])CVar8.passed;
  sVar5 = Counts::total((Counts *)local_378);
  if (sVar5 == 0) {
    pCVar6 = Config::data(this->m_config);
    if ((pCVar6->warnings & NoAssertions) != Nothing) {
      bVar1 = RunningTest::hasSections(this->m_runningTest);
      if (!bVar1) {
        (this->m_totals).assertions.failed = (this->m_totals).assertions.failed + 1;
        pIVar3 = Ptr<Catch::IReporter>::operator->(&this->m_reporter);
        pTVar4 = RunningTest::getTestCaseInfo(this->m_runningTest);
        psVar7 = TestCaseInfo::getName_abi_cxx11_(pTVar4);
        (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])(pIVar3,psVar7);
      }
    }
  }
  RunningTest::ranToCompletion(this->m_runningTest);
  std::vector<Catch::ResultInfo,_std::allocator<Catch::ResultInfo>_>::clear(&this->m_info);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            try {
                m_runningTest->reset();
                Counts prevAssertions = m_totals.assertions;
                if( m_reporter->shouldRedirectStdout() ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_runningTest->getTestCaseInfo().invoke();
                }
                else {
                    m_runningTest->getTestCaseInfo().invoke();
                }
                Counts assertions = m_totals.assertions - prevAssertions;
                if( assertions.total() == 0  &&
                   ( m_config.data().warnings & ConfigData::WarnAbout::NoAssertions ) &&
                   !m_runningTest->hasSections() ) {
                        m_totals.assertions.failed++;
                        m_reporter->NoAssertionsInTestCase( m_runningTest->getTestCaseInfo().getName() );
                }
                m_runningTest->ranToCompletion();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                acceptMessage( getRegistryHub().getExceptionTranslatorRegistry().translateActiveException() );
                acceptResult( ResultWas::ThrewException );
            }
            m_info.clear();
        }